

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addressmap-inl.h
# Opt level: O0

pair<int,_unsigned_long> * __thiscall
AddressMap<std::pair<int,_unsigned_long>_>::FindMutable
          (AddressMap<std::pair<int,_unsigned_long>_> *this,Key key)

{
  int iVar1;
  Cluster *pCVar2;
  Entry *local_38;
  Entry *e;
  Cluster *c;
  Number num;
  Key key_local;
  AddressMap<std::pair<int,_unsigned_long>_> *this_local;
  
  pCVar2 = FindCluster(this,(Number)key,false);
  if (pCVar2 != (Cluster *)0x0) {
    iVar1 = BlockID((Number)key);
    for (local_38 = pCVar2->blocks[iVar1]; local_38 != (Entry *)0x0; local_38 = local_38->next) {
      if (local_38->key == key) {
        return &local_38->value;
      }
    }
  }
  return (pair<int,_unsigned_long> *)0x0;
}

Assistant:

inline Value* AddressMap<Value>::FindMutable(Key key) {
  const Number num = reinterpret_cast<Number>(key);
  const Cluster* const c = FindCluster(num, false/*do not create*/);
  if (c != nullptr) {
    for (Entry* e = c->blocks[BlockID(num)]; e != nullptr; e = e->next) {
      if (e->key == key) {
        return &e->value;
      }
    }
  }
  return nullptr;
}